

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall deqp::gls::LifetimeTests::details::ES2Types::ES2Types(ES2Types *this,Context *ctx)

{
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  *this_00;
  vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  *this_01;
  vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  *this_02;
  ContextWrapper *pCVar1;
  Context *pCVar2;
  RboFboAttacher *pRVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  TestContext *pTVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  Type *types [6];
  Attacher *local_118;
  Attacher *local_110;
  Type *local_108;
  ContextWrapper *local_100;
  ContextWrapper *local_f8;
  ContextWrapper *local_f0;
  ContextWrapper *local_e8;
  ContextWrapper *local_e0;
  ContextWrapper *local_d8;
  ContextWrapper *local_d0;
  ContextWrapper *local_c8;
  ContextWrapper *local_c0;
  ContextWrapper *local_b8;
  ContextWrapper *local_b0;
  ContextWrapper *local_a8;
  ContextWrapper *local_a0;
  ContextWrapper *local_98;
  ContextWrapper *local_90;
  ContextWrapper *local_88;
  ContextWrapper *local_80;
  ContextWrapper *local_78;
  SimpleType *local_70;
  SimpleType *local_68;
  SimpleType *local_60;
  SimpleType *local_58;
  Type *local_50;
  ShaderType *local_48;
  ProgramType *local_40;
  
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(this->super_Types).super_ContextWrapper.super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar8),ctx->m_testCtx->m_log);
  pTVar7 = ctx->m_testCtx;
  (this->super_Types).super_ContextWrapper.m_ctx.m_renderCtx = ctx->m_renderCtx;
  (this->super_Types).super_ContextWrapper.m_ctx.m_testCtx = pTVar7;
  (this->super_Types).super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->super_Types).m_types.
  super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Types).m_types.
  super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Types).m_types.
  super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Types).m_attachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Types).m_attachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Types).m_attachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Types).m_inAttachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Types).m_inAttachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Types).m_inAttachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Types).m_outAttachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Types).m_outAttachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Types).m_outAttachers.
  super__Vector_base<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Types)._vptr_Types = (_func_int **)&PTR_getProgramType_00d1e488;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = &(this->m_bufferBind).super_Binder.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&pCVar1->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_00,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_bufferBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_bufferBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx + 4) = uVar4;
  *(undefined4 *)&(this->m_bufferBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_bufferBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx + 4)
       = uVar6;
  (this->m_bufferBind).super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_bufferBind).super_Binder._vptr_Binder = (_func_int **)&PTR__Binder_00d54500;
  (this->m_bufferBind).m_bindFunc = (BindFunc)glu::CallLogWrapper::glBindBuffer;
  *(undefined8 *)&(this->m_bufferBind).field_0x38 = 0;
  (this->m_bufferBind).m_bindTarget = 0x8892;
  (this->m_bufferBind).m_bindingParam = 0x8894;
  (this->m_bufferBind).m_genRequired = false;
  local_78 = pCVar1;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = &(this->m_bufferType).super_Type.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&pCVar1->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_01,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_bufferType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)((long)&(this->m_bufferType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx + 4)
       = uVar4;
  *(undefined4 *)&(this->m_bufferType).super_Type.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_bufferType).super_Type.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_bufferType).super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_bufferType).super_Type._vptr_Type = (_func_int **)&PTR__Type_00d54550;
  (this->m_bufferType).m_getName = "buffer";
  (this->m_bufferType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenBuffers;
  *(undefined8 *)&(this->m_bufferType).field_0x40 = 0;
  (this->m_bufferType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteBuffers;
  *(undefined8 *)&(this->m_bufferType).field_0x50 = 0;
  (this->m_bufferType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsBuffer;
  *(undefined8 *)&(this->m_bufferType).field_0x60 = 0;
  (this->m_bufferType).m_binder = &(this->m_bufferBind).super_Binder;
  (this->m_bufferType).m_genCreates = false;
  local_80 = pCVar1;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_88 = &(this->m_textureBind).super_Binder.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_88->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_02,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_textureBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_textureBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx + 4) = uVar4;
  *(undefined4 *)&(this->m_textureBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)
   ((long)&(this->m_textureBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx + 4) = uVar6;
  (this->m_textureBind).super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_textureBind).super_Binder._vptr_Binder = (_func_int **)&PTR__Binder_00d54500;
  (this->m_textureBind).m_bindFunc = (BindFunc)glu::CallLogWrapper::glBindTexture;
  *(undefined8 *)&(this->m_textureBind).field_0x38 = 0;
  (this->m_textureBind).m_bindTarget = 0xde1;
  (this->m_textureBind).m_bindingParam = 0x8069;
  (this->m_textureBind).m_genRequired = false;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_90 = &(this->m_textureType).super_Type.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_90->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_03,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_textureType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_textureType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx + 4) = uVar4;
  *(undefined4 *)&(this->m_textureType).super_Type.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_textureType).super_Type.super_ContextWrapper.m_ctx.m_testCtx + 4)
       = uVar6;
  (this->m_textureType).super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_textureType).super_Type._vptr_Type = (_func_int **)&PTR__Type_00d54550;
  (this->m_textureType).m_getName = "texture";
  (this->m_textureType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenTextures;
  *(undefined8 *)&(this->m_textureType).field_0x40 = 0;
  (this->m_textureType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteTextures;
  *(undefined8 *)&(this->m_textureType).field_0x50 = 0;
  (this->m_textureType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsTexture;
  *(undefined8 *)&(this->m_textureType).field_0x60 = 0;
  (this->m_textureType).m_binder = &(this->m_textureBind).super_Binder;
  (this->m_textureType).m_genCreates = false;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_98 = &(this->m_rboBind).super_Binder.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_98->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_04,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_rboBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)((long)&(this->m_rboBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx + 4)
       = uVar4;
  *(undefined4 *)&(this->m_rboBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_rboBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_rboBind).super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_rboBind).super_Binder._vptr_Binder = (_func_int **)&PTR__Binder_00d54500;
  (this->m_rboBind).m_bindFunc = (BindFunc)glu::CallLogWrapper::glBindRenderbuffer;
  *(undefined8 *)&(this->m_rboBind).field_0x38 = 0;
  (this->m_rboBind).m_bindTarget = 0x8d41;
  (this->m_rboBind).m_bindingParam = 0x8ca7;
  (this->m_rboBind).m_genRequired = false;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_a0 = &(this->m_rboType).super_Type.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_a0->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_05,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_rboType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)((long)&(this->m_rboType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_rboType).super_Type.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_rboType).super_Type.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_rboType).super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_rboType).super_Type._vptr_Type = (_func_int **)&PTR__Type_00d54550;
  (this->m_rboType).m_getName = "renderbuffer";
  (this->m_rboType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenRenderbuffers;
  *(undefined8 *)&(this->m_rboType).field_0x40 = 0;
  (this->m_rboType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteRenderbuffers;
  *(undefined8 *)&(this->m_rboType).field_0x50 = 0;
  (this->m_rboType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsRenderbuffer;
  *(undefined8 *)&(this->m_rboType).field_0x60 = 0;
  (this->m_rboType).m_binder = &(this->m_rboBind).super_Binder;
  (this->m_rboType).m_genCreates = false;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_a8 = &(this->m_fboBind).super_Binder.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_a8->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_06,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_fboBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)((long)&(this->m_fboBind).super_Binder.super_ContextWrapper.m_ctx.m_renderCtx + 4)
       = uVar4;
  *(undefined4 *)&(this->m_fboBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_fboBind).super_Binder.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_fboBind).super_Binder.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_fboBind).super_Binder._vptr_Binder = (_func_int **)&PTR__Binder_00d54500;
  (this->m_fboBind).m_bindFunc = (BindFunc)glu::CallLogWrapper::glBindFramebuffer;
  *(undefined8 *)&(this->m_fboBind).field_0x38 = 0;
  (this->m_fboBind).m_bindTarget = 0x8d40;
  (this->m_fboBind).m_bindingParam = 0x8ca6;
  (this->m_fboBind).m_genRequired = false;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = &(this->m_fboType).super_Type.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&pCVar1->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_07,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_fboType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)((long)&(this->m_fboType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_fboType).super_Type.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_fboType).super_Type.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_fboType).super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_fboType).super_Type._vptr_Type = (_func_int **)&PTR__Type_00d54550;
  (this->m_fboType).m_getName = "framebuffer";
  (this->m_fboType).m_genFunc = (GenFunc)glu::CallLogWrapper::glGenFramebuffers;
  *(undefined8 *)&(this->m_fboType).field_0x40 = 0;
  (this->m_fboType).m_deleteFunc = (DeleteFunc)glu::CallLogWrapper::glDeleteFramebuffers;
  *(undefined8 *)&(this->m_fboType).field_0x50 = 0;
  (this->m_fboType).m_existsFunc = (ExistsFunc)glu::CallLogWrapper::glIsFramebuffer;
  *(undefined8 *)&(this->m_fboType).field_0x60 = 0;
  (this->m_fboType).m_binder = &(this->m_fboBind).super_Binder;
  (this->m_fboType).m_genCreates = false;
  local_b0 = pCVar1;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = &(this->m_shaderType).super_Type.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&pCVar1->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_08,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_shaderType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)((long)&(this->m_shaderType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx + 4)
       = uVar4;
  *(undefined4 *)&(this->m_shaderType).super_Type.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_shaderType).super_Type.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_shaderType).super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_shaderType).super_Type._vptr_Type = (_func_int **)&PTR__Type_00d54640;
  local_b8 = pCVar1;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_c0 = &(this->m_programType).super_Type.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_c0->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_09,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_programType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_programType).super_Type.super_ContextWrapper.m_ctx.m_renderCtx + 4) = uVar4;
  *(undefined4 *)&(this->m_programType).super_Type.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)((long)&(this->m_programType).super_Type.super_ContextWrapper.m_ctx.m_testCtx + 4)
       = uVar6;
  (this->m_programType).super_Type.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_programType).super_Type._vptr_Type = (_func_int **)&PTR__Type_00d545c8;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_c8 = &(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_c8->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_10,iVar8),
             ctx->m_testCtx->m_log);
  local_70 = &this->m_textureType;
  local_108 = &(this->m_fboType).super_Type;
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)
   &(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
           m_renderCtx + 4) = uVar4;
  *(undefined4 *)
   &(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_testCtx
   + 4) = uVar6;
  (this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.super_CallLogWrapper.
  m_enableLog = true;
  (this->m_texFboAtt).super_FboAttacher.super_Attacher.m_elementType = &local_70->super_Type;
  (this->m_texFboAtt).super_FboAttacher.super_Attacher.m_containerType = local_108;
  (this->m_texFboAtt).super_FboAttacher.super_Attacher._vptr_Attacher =
       (_func_int **)&PTR_initAttachment_00d54788;
  iVar8 = (*((this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_renderCtx)->_vptr_RenderContext[3])();
  local_d0 = &(this->m_texFboInAtt).super_InputAttacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_d0->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_11,iVar8),
             ((this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
             m_testCtx)->m_log);
  local_110 = (Attacher *)&this->m_texFboAtt;
  pCVar2 = &(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx;
  uVar4 = *(undefined4 *)
           ((long)&(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_renderCtx + 4);
  uVar5 = *(undefined4 *)
           &(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_testCtx;
  uVar6 = *(undefined4 *)
           ((long)&(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_testCtx + 4);
  *(undefined4 *)&(this->m_texFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&pCVar2->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_texFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_texFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_texFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_texFboInAtt).super_InputAttacher.super_ContextWrapper.super_CallLogWrapper.m_enableLog =
       true;
  (this->m_texFboInAtt).super_InputAttacher.m_attacher = local_110;
  (this->m_texFboInAtt).super_InputAttacher._vptr_InputAttacher =
       (_func_int **)&PTR_drawContainer_00d54720;
  iVar8 = (*((this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_renderCtx)->_vptr_RenderContext[3])();
  local_d8 = &(this->m_texFboOutAtt).super_OutputAttacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_d8->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_12,iVar8),
             ((this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
             m_testCtx)->m_log);
  uVar4 = *(undefined4 *)
           ((long)&(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_renderCtx + 4);
  uVar5 = *(undefined4 *)
           &(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_testCtx;
  uVar6 = *(undefined4 *)
           ((long)&(this->m_texFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_testCtx + 4);
  *(undefined4 *)&(this->m_texFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_renderCtx
       = *(undefined4 *)&pCVar2->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_texFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_texFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_texFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_texFboOutAtt).super_OutputAttacher.super_ContextWrapper.super_CallLogWrapper.m_enableLog
       = true;
  (this->m_texFboOutAtt).super_OutputAttacher.m_attacher = local_110;
  (this->m_texFboOutAtt).super_OutputAttacher._vptr_OutputAttacher =
       (_func_int **)&PTR_setupContainer_00d54750;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = &(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&pCVar1->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_13,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)
   &(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
           m_renderCtx + 4) = uVar4;
  *(undefined4 *)
   &(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.m_testCtx
   + 4) = uVar6;
  (this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.super_CallLogWrapper.
  m_enableLog = true;
  (this->m_rboFboAtt).super_FboAttacher.super_Attacher.m_elementType = &(this->m_rboType).super_Type
  ;
  (this->m_rboFboAtt).super_FboAttacher.super_Attacher.m_containerType = local_108;
  (this->m_rboFboAtt).super_FboAttacher.super_Attacher._vptr_Attacher =
       (_func_int **)&PTR_initAttachment_00d547f0;
  local_e0 = pCVar1;
  iVar8 = (*((this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_renderCtx)->_vptr_RenderContext[3])();
  local_e8 = &(this->m_rboFboInAtt).super_InputAttacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_e8->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_14,iVar8),
             ((this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
             m_testCtx)->m_log);
  pRVar3 = &this->m_rboFboAtt;
  pCVar2 = &(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx;
  uVar4 = *(undefined4 *)
           ((long)&(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_renderCtx + 4);
  uVar5 = *(undefined4 *)
           &(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_testCtx;
  uVar6 = *(undefined4 *)
           ((long)&(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_testCtx + 4);
  *(undefined4 *)&(this->m_rboFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&pCVar2->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_rboFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_rboFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_rboFboInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_rboFboInAtt).super_InputAttacher.super_ContextWrapper.super_CallLogWrapper.m_enableLog =
       true;
  (this->m_rboFboInAtt).super_InputAttacher.m_attacher = (Attacher *)pRVar3;
  (this->m_rboFboInAtt).super_InputAttacher._vptr_InputAttacher =
       (_func_int **)&PTR_drawContainer_00d54720;
  iVar8 = (*((this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_renderCtx)->_vptr_RenderContext[3])();
  local_f0 = &(this->m_rboFboOutAtt).super_OutputAttacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_f0->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_15,iVar8),
             ((this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
             m_testCtx)->m_log);
  uVar4 = *(undefined4 *)
           ((long)&(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_renderCtx + 4);
  uVar5 = *(undefined4 *)
           &(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
            m_testCtx;
  uVar6 = *(undefined4 *)
           ((long)&(this->m_rboFboAtt).super_FboAttacher.super_Attacher.super_ContextWrapper.m_ctx.
                   m_testCtx + 4);
  *(undefined4 *)&(this->m_rboFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_renderCtx
       = *(undefined4 *)&pCVar2->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_rboFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_rboFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_rboFboOutAtt).super_OutputAttacher.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_rboFboOutAtt).super_OutputAttacher.super_ContextWrapper.super_CallLogWrapper.m_enableLog
       = true;
  (this->m_rboFboOutAtt).super_OutputAttacher.m_attacher = (Attacher *)pRVar3;
  (this->m_rboFboOutAtt).super_OutputAttacher._vptr_OutputAttacher =
       (_func_int **)&PTR_setupContainer_00d54750;
  iVar8 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  local_f8 = &(this->m_shaderAtt).super_Attacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_f8->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_16,iVar8),
             ctx->m_testCtx->m_log);
  uVar4 = *(undefined4 *)((long)&ctx->m_renderCtx + 4);
  uVar5 = *(undefined4 *)&ctx->m_testCtx;
  uVar6 = *(undefined4 *)((long)&ctx->m_testCtx + 4);
  *(undefined4 *)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&ctx->m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx + 4) = uVar4;
  *(undefined4 *)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_testCtx = uVar5;
  *(undefined4 *)
   ((long)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_testCtx + 4) = uVar6;
  (this->m_shaderAtt).super_Attacher.super_ContextWrapper.super_CallLogWrapper.m_enableLog = true;
  (this->m_shaderAtt).super_Attacher.m_elementType = &(this->m_shaderType).super_Type;
  (this->m_shaderAtt).super_Attacher.m_containerType = &(this->m_programType).super_Type;
  (this->m_shaderAtt).super_Attacher._vptr_Attacher = (_func_int **)&PTR_initAttachment_00d54858;
  iVar8 = (*((this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  local_100 = &(this->m_shaderInAtt).super_InputAttacher.super_ContextWrapper;
  glu::CallLogWrapper::CallLogWrapper
            (&local_100->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var_17,iVar8),
             ((this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_testCtx)->m_log);
  local_68 = &this->m_bufferType;
  uVar4 = *(undefined4 *)
           ((long)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx + 4);
  uVar5 = *(undefined4 *)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_testCtx;
  uVar6 = *(undefined4 *)
           ((long)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_testCtx + 4);
  *(undefined4 *)&(this->m_shaderInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_renderCtx =
       *(undefined4 *)&(this->m_shaderAtt).super_Attacher.super_ContextWrapper.m_ctx.m_renderCtx;
  *(undefined4 *)
   ((long)&(this->m_shaderInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_renderCtx + 4) =
       uVar4;
  *(undefined4 *)&(this->m_shaderInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx =
       uVar5;
  *(undefined4 *)
   ((long)&(this->m_shaderInAtt).super_InputAttacher.super_ContextWrapper.m_ctx.m_testCtx + 4) =
       uVar6;
  (this->m_shaderInAtt).super_InputAttacher.super_ContextWrapper.super_CallLogWrapper.m_enableLog =
       true;
  (this->m_shaderInAtt).super_InputAttacher.m_attacher = &(this->m_shaderAtt).super_Attacher;
  (this->m_shaderInAtt).super_InputAttacher._vptr_InputAttacher =
       (_func_int **)&PTR_drawContainer_00d548b8;
  local_60 = local_70;
  local_50 = local_108;
  local_58 = &this->m_rboType;
  local_48 = &this->m_shaderType;
  local_40 = &this->m_programType;
  std::
  vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
  ::_M_range_insert<deqp::gls::LifetimeTests::details::Type*const*>
            ((vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
              *)&(this->super_Types).m_types,
             (this->super_Types).m_types.
             super__Vector_base<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_68);
  this_00 = &(this->super_Types).m_attachers;
  local_118 = local_110;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
            ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
              *)this_00,&local_118);
  local_118 = (Attacher *)pRVar3;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
            ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
              *)this_00,&local_118);
  local_118 = &(this->m_shaderAtt).super_Attacher;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::Attacher*>
            ((vector<deqp::gls::LifetimeTests::details::Attacher*,std::allocator<deqp::gls::LifetimeTests::details::Attacher*>>
              *)this_00,&local_118);
  local_118 = (Attacher *)&this->m_texFboInAtt;
  this_01 = &(this->super_Types).m_inAttachers;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
              *)this_01,(InputAttacher **)&local_118);
  local_118 = (Attacher *)&this->m_rboFboInAtt;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
              *)this_01,(InputAttacher **)&local_118);
  local_118 = (Attacher *)&this->m_shaderInAtt;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::InputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::InputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::InputAttacher*>>
              *)this_01,(InputAttacher **)&local_118);
  local_118 = (Attacher *)&this->m_texFboOutAtt;
  this_02 = &(this->super_Types).m_outAttachers;
  std::
  vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::OutputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
              *)this_02,(OutputAttacher **)&local_118);
  local_118 = (Attacher *)&this->m_rboFboOutAtt;
  std::
  vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
  ::emplace_back<deqp::gls::LifetimeTests::details::OutputAttacher*>
            ((vector<deqp::gls::LifetimeTests::details::OutputAttacher*,std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher*>>
              *)this_02,(OutputAttacher **)&local_118);
  return;
}

Assistant:

ES2Types::ES2Types (const Context& ctx)
	: Types			(ctx)
	, m_bufferBind	(ctx, &CallLogWrapper::glBindBuffer,
					 GL_ARRAY_BUFFER, GL_ARRAY_BUFFER_BINDING)
	, m_bufferType	(ctx, "buffer", &CallLogWrapper::glGenBuffers,
					 &CallLogWrapper::glDeleteBuffers,
					 &CallLogWrapper::glIsBuffer, &m_bufferBind)
	, m_textureBind	(ctx, &CallLogWrapper::glBindTexture, GL_TEXTURE_2D, GL_TEXTURE_BINDING_2D)
	, m_textureType	(ctx, "texture", &CallLogWrapper::glGenTextures,
					 &CallLogWrapper::glDeleteTextures,
					 &CallLogWrapper::glIsTexture, &m_textureBind)
	, m_rboBind		(ctx, &CallLogWrapper::glBindRenderbuffer,
					 GL_RENDERBUFFER, GL_RENDERBUFFER_BINDING)
	, m_rboType		(ctx, "renderbuffer",
					 &CallLogWrapper::glGenRenderbuffers,
					 &CallLogWrapper::glDeleteRenderbuffers,
					 &CallLogWrapper::glIsRenderbuffer, &m_rboBind)
	, m_fboBind		(ctx, &CallLogWrapper::glBindFramebuffer,
					 GL_FRAMEBUFFER, GL_FRAMEBUFFER_BINDING)
	, m_fboType		(ctx, "framebuffer",
					 &CallLogWrapper::glGenFramebuffers,
					 &CallLogWrapper::glDeleteFramebuffers,
					 &CallLogWrapper::glIsFramebuffer, &m_fboBind)
	, m_shaderType	(ctx)
	, m_programType	(ctx)
	, m_texFboAtt	(ctx, m_textureType, m_fboType)
	, m_texFboInAtt	(m_texFboAtt)
	, m_texFboOutAtt(m_texFboAtt)
	, m_rboFboAtt	(ctx, m_rboType, m_fboType)
	, m_rboFboInAtt	(m_rboFboAtt)
	, m_rboFboOutAtt(m_rboFboAtt)
	, m_shaderAtt	(ctx, m_shaderType, m_programType)
	, m_shaderInAtt	(m_shaderAtt)
{
	Type* const types[] =
	{
		&m_bufferType, &m_textureType, &m_rboType, &m_fboType, &m_shaderType, &m_programType
	};
	m_types.insert(m_types.end(), DE_ARRAY_BEGIN(types), DE_ARRAY_END(types));

	m_attachers.push_back(&m_texFboAtt);
	m_attachers.push_back(&m_rboFboAtt);
	m_attachers.push_back(&m_shaderAtt);

	m_inAttachers.push_back(&m_texFboInAtt);
	m_inAttachers.push_back(&m_rboFboInAtt);
	m_inAttachers.push_back(&m_shaderInAtt);

	m_outAttachers.push_back(&m_texFboOutAtt);
	m_outAttachers.push_back(&m_rboFboOutAtt);
}